

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O2

string * __thiscall
util::variant::GetString_abi_cxx11_(string *__return_storage_ptr__,variant *this)

{
  var_type vVar1;
  char buf [1024];
  char acStack_418 [1024];
  
  if (this->cache_val[2] != true) {
    this->cache_val[2] = true;
    vVar1 = this->type;
    if (vVar1 != type_bool) {
      if (vVar1 == type_float) {
        snprintf(acStack_418,0x400,"%g",this->val_float);
      }
      else {
        if (vVar1 != type_int) goto LAB_001767c3;
        snprintf(acStack_418,0x400,"%i",(ulong)(uint)this->val_int);
      }
    }
    std::__cxx11::string::assign((char *)&this->val_string);
  }
LAB_001767c3:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->val_string);
  return __return_storage_ptr__;
}

Assistant:

std::string variant::GetString() const
{
	if (this->cache_val[type_string])
	{
		return this->val_string;
	}
	this->cache_val[type_string] = true;

	char buf[1024];

	using namespace std;

	switch (this->type)
	{
		case type_int:
			snprintf(buf, 1024, "%i", this->val_int);
			this->val_string = buf;
			break;

		case type_float:
			snprintf(buf, 1024, "%g", this->val_float);
			this->val_string = buf;
			break;

		case type_bool:
			this->val_string = this->val_bool ? "yes" : "no";
			break;

		default: ; // Shut the compiler up
	}

	return this->val_string;
}